

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_default_xml_generator.hpp
# Opt level: O1

void __thiscall
iutest::DefaultXmlGeneratorListener::~DefaultXmlGeneratorListener(DefaultXmlGeneratorListener *this)

{
  pointer pcVar1;
  Variable *pVVar2;
  TestEventListener *pTVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__DefaultXmlGeneratorListener_0012a230;
  if (this->m_fp != (IFile *)0x0) {
    (*(this->m_fp->super_IOutStream)._vptr_IOutStream[4])();
    if (detail::IFileSystem::GetInstanceVariable()::v != (long *)0x0) {
      (**(code **)(*detail::IFileSystem::GetInstanceVariable()::v + 0x20))
                (detail::IFileSystem::GetInstanceVariable()::v,this->m_fp);
    }
    this->m_fp = (IFile *)0x0;
  }
  pVVar2 = TestEnv::get_vars();
  pTVar3 = TestEventListeners::Release
                     (&pVVar2->m_event_listeners,(pVVar2->m_event_listeners).m_default_xml_generator
                     );
  if (pTVar3 != (TestEventListener *)0x0) {
    (*pTVar3->_vptr_TestEventListener[1])(pTVar3);
  }
  (pVVar2->m_event_listeners).m_default_xml_generator = (TestEventListener *)0x0;
  pcVar1 = (this->m_output_path)._M_dataplus._M_p;
  paVar4 = &(this->m_output_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_output_path_format)._M_dataplus._M_p;
  paVar4 = &(this->m_output_path_format).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~DefaultXmlGeneratorListener()
    {
        FileClose();
        TestEnv::event_listeners().set_default_xml_generator(NULL);
    }